

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O2

IDenseNetwork * __thiscall
IDenseNetworkBuilder::Build
          (IDenseNetworkBuilder *this,vector<LayerMeta,_std::allocator<LayerMeta>_> *layersMeta,
          ISynapseBuilder *synapseBuilder,ILayerBuilder *layerBuilder,IEventManager *eventManager,
          default_random_engine *generator,float induceDistLimit)

{
  pointer pLVar1;
  ILayer *pIVar2;
  size_t sVar3;
  IDenseNetwork *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  float local_bc;
  vector<ILayer_*,_std::allocator<ILayer_*>_> layers;
  _Vector_base<ILayer_*,_std::allocator<ILayer_*>_> local_88;
  undefined1 local_70 [64];
  
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::resize
            (&layers,(long)(layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 6);
  lVar7 = 0;
  for (uVar6 = 0;
      pLVar1 = (layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 6);
      uVar6 = uVar6 + 1) {
    LayerMeta::LayerMeta((LayerMeta *)local_70,(LayerMeta *)((long)&pLVar1->alpha + lVar7));
    pIVar2 = (ILayer *)(*(code *)**(undefined8 **)layerBuilder)(layerBuilder,(LayerMeta *)local_70);
    layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar6] = pIVar2;
    std::__cxx11::string::~string((string *)(local_70 + 8));
    lVar7 = lVar7 + 0x40;
  }
  local_bc = 0.0;
  uVar6 = 0;
  while (uVar5 = uVar6,
        uVar4 = (long)layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3, uVar5 < uVar4) {
    uVar6 = uVar5 + 1;
    if (uVar6 < uVar4) {
      sVar3 = ILayer::GetSize(layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl
                              .super__Vector_impl_data._M_start[uVar5 + 1]);
    }
    else {
      sVar3 = 0;
    }
    fVar8 = ILayer::GetZShift(layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl
                              .super__Vector_impl_data._M_start[uVar5]);
    local_bc = local_bc + fVar8;
    (*layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar5]->_vptr_ILayer[2])
              (local_bc,layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar5],sVar3,generator);
    if (sVar3 != 0) {
      (*layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5]->_vptr_ILayer[0xb])
                (layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5],
                 layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5 + 1],synapseBuilder);
    }
  }
  pVar9 = BuildSpatialConnections(&layers,induceDistLimit * induceDistLimit);
  this_00 = (IDenseNetwork *)operator_new(0x30);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::vector
            ((vector<ILayer_*,_std::allocator<ILayer_*>_> *)&local_88,&layers);
  IDenseNetwork::IDenseNetwork
            (this_00,(vector<ILayer_*,_std::allocator<ILayer_*>_> *)&local_88,eventManager,
             pVar9.first,pVar9.second);
  std::_Vector_base<ILayer_*,_std::allocator<ILayer_*>_>::~_Vector_base(&local_88);
  std::_Vector_base<ILayer_*,_std::allocator<ILayer_*>_>::~_Vector_base
            (&layers.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>);
  return this_00;
}

Assistant:

IDenseNetwork *
IDenseNetworkBuilder::Build( const std::vector<LayerMeta> &layersMeta, const ISynapseBuilder &synapseBuilder,
                             const ILayerBuilder &layerBuilder, IEventManager &eventManager,
                             std::default_random_engine &generator, float induceDistLimit ) const
{
    float squaredDistLimit = induceDistLimit * induceDistLimit;
    std::vector<ILayer *> layers;
    layers.resize( layersMeta.size());
    for ( int ldx = 0; ldx < layersMeta.size(); ++ldx ) {
        layers[ldx] = layerBuilder.Build( layersMeta[ldx] );
    }
    float zShift = 0;

    for ( size_t ldx = 0; ldx < layers.size(); ++ldx ) {
        size_t nextLayerSize = ldx + 1 < layers.size() ? layers[ldx + 1]->GetSize() : 0;
        zShift += layers[ldx]->GetZShift();
        layers[ldx]->Init( nextLayerSize, generator, zShift );
        if ( nextLayerSize ) {
            layers[ldx]->BindWithNext( *layers[ldx + 1], synapseBuilder );
        }
    }
    auto sConnectionsInfo = BuildSpatialConnections( layers, squaredDistLimit );
    return new IDenseNetwork( layers, eventManager, sConnectionsInfo.first, sConnectionsInfo.second );
}